

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O1

bool __thiscall ON_Brep::Read(ON_Brep *this,ON_BinaryArchive *file)

{
  ON_BoundingBox *this_00;
  double *pdVar1;
  ON_BrepEdge *pOVar2;
  ON_BrepTrim *pOVar3;
  ON_BrepLoop *pOVar4;
  ON_BrepFace *pOVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  uint uVar14;
  int iVar15;
  ON_Mesh *pOVar16;
  ON_BrepRegionTopology *pOVar17;
  ulong uVar18;
  ON_BoundingBox *pOVar19;
  long lVar20;
  ON_BoundingBox *a;
  long lVar21;
  ON_CurveProxy *pOVar22;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  ON_Interval OVar25;
  ON_Interval domain;
  ON_Interval real_curve_subdomain;
  ON_Interval domain_00;
  int minor_version;
  ON_Object *obj;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK;
  int major_version;
  uchar b;
  ON__UINT32 tcode;
  ON_BoundingBox archive_brep_bbox;
  int local_1cc;
  ON_BinaryArchive *local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  int local_1a4;
  int local_1a0;
  int local_19c;
  ON_BoundingBox local_198;
  ON_BoundingBox local_168;
  int local_12c;
  ON_BoundingBox local_128;
  ON_BoundingBox local_f8;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  undefined4 uVar23;
  undefined4 uVar24;
  
  local_12c = 0;
  local_1cc = 0;
  bVar11 = ON_BinaryArchive::Read3dmChunkVersion(file,&local_12c,&local_1cc);
  if (local_12c == 2 && bVar11) {
    bVar11 = ReadOld200(this,file,local_1cc);
    goto LAB_0040a881;
  }
  if (local_12c != 3 || !bVar11) goto LAB_0040a881;
  bVar11 = ON_CurveArray::Read(&this->m_C2,file);
  local_1a0 = (this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count;
  if (bVar11) {
    bVar11 = ON_CurveArray::Read(&this->m_C3,file);
  }
  local_1a4 = (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_count;
  if (bVar11 != false) {
    bVar11 = ON_SurfaceArray::Read(&this->m_S,file);
  }
  local_19c = (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count;
  if (bVar11 != false) {
    bVar11 = ON_BrepVertexArray::Read(&this->m_V,file);
  }
  if (((bVar11 != false) && (bVar11 = ON_BrepEdgeArray::Read(&this->m_E,file), bVar11)) &&
     (0 < (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count)) {
    lVar20 = 0;
    lVar21 = 0;
    local_1c8 = file;
    do {
      pOVar2 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
      *(ON_Brep **)((long)pOVar2->m_vi + lVar20 + 0x2c) = this;
      iVar15 = *(int *)((long)pOVar2->m_vi + lVar20 + -4);
      if ((-1 < iVar15) && (iVar15 < local_1a4)) {
        pOVar22 = (ON_CurveProxy *)
                  ((long)&(((ON_CurveProxy *)
                           (&(pOVar2->super_ON_CurveProxy).m_real_curve_domain + -2))->
                          super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object + lVar20
                  );
        bVar13 = ON_CurveProxy::ProxyCurveIsReversed(pOVar22);
        OVar25 = ON_CurveProxy::ProxyCurveDomain(pOVar22);
        uVar23 = OVar25.m_t[1]._0_4_;
        uVar24 = OVar25.m_t[1]._4_4_;
        local_1b8 = OVar25.m_t[0];
        local_1c0 = OVar25.m_t[1];
        (*(pOVar22->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
                  (pOVar22);
        domain.m_t[0]._4_4_ = extraout_XMM0_Db;
        domain.m_t[0]._0_4_ = extraout_XMM0_Da;
        local_1b0 = (double)CONCAT44(uVar24,uVar23);
        OVar25.m_t[1] = local_1c0;
        OVar25.m_t[0] = local_1b8;
        ON_CurveProxy::SetProxyCurve
                  (pOVar22,(this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_a
                           [*(int *)&pOVar22[1].m_real_curve],OVar25);
        if (bVar13) {
          ON_CurveProxy::Reverse(pOVar22);
        }
        domain.m_t[1] = local_1b0;
        ON_CurveProxy::SetDomain(pOVar22,domain);
      }
      lVar21 = lVar21 + 1;
      lVar20 = lVar20 + 0x88;
      file = local_1c8;
    } while (lVar21 < (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>
                      .m_count);
  }
  if (((bVar11 != false) && (bVar11 = ON_BrepTrimArray::Read(&this->m_T,file), bVar11)) &&
     (0 < (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count)) {
    lVar20 = 0;
    lVar21 = 0;
    local_1c8 = file;
    do {
      pOVar3 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
      *(ON_Brep **)((long)pOVar3->m_tolerance + lVar20 + 0x70) = this;
      iVar15 = *(int *)((long)pOVar3->m_vi + lVar20 + -8);
      if ((-1 < iVar15) && (iVar15 < local_1a0)) {
        pOVar22 = (ON_CurveProxy *)
                  ((long)&(((ON_CurveProxy *)
                           (&(pOVar3->super_ON_CurveProxy).m_real_curve_domain + -2))->
                          super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object + lVar20
                  );
        bVar13 = ON_CurveProxy::ProxyCurveIsReversed(pOVar22);
        OVar25 = ON_CurveProxy::ProxyCurveDomain(pOVar22);
        uVar23 = OVar25.m_t[1]._0_4_;
        uVar24 = OVar25.m_t[1]._4_4_;
        local_1b8 = OVar25.m_t[0];
        local_1c0 = OVar25.m_t[1];
        (*(pOVar22->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
                  (pOVar22);
        domain_00.m_t[0]._4_4_ = extraout_XMM0_Db_00;
        domain_00.m_t[0]._0_4_ = extraout_XMM0_Da_00;
        local_1b0 = (double)CONCAT44(uVar24,uVar23);
        real_curve_subdomain.m_t[1] = local_1c0;
        real_curve_subdomain.m_t[0] = local_1b8;
        ON_CurveProxy::SetProxyCurve
                  (pOVar22,(this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_a
                           [*(int *)&pOVar22[1].m_real_curve],real_curve_subdomain);
        if (bVar13) {
          ON_CurveProxy::Reverse(pOVar22);
        }
        domain_00.m_t[1] = local_1b0;
        ON_CurveProxy::SetDomain(pOVar22,domain_00);
      }
      lVar21 = lVar21 + 1;
      lVar20 = lVar20 + 0xe8;
      file = local_1c8;
    } while (lVar21 < (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>
                      .m_count);
  }
  if (((bVar11 != false) && (bVar11 = ON_BrepLoopArray::Read(&this->m_L,file), bVar11)) &&
     (lVar20 = (long)(this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
                     m_count, 0 < lVar20)) {
    pOVar4 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
    lVar21 = 0;
    do {
      *(ON_Brep **)((long)&pOVar4->m_brep + lVar21) = this;
      lVar21 = lVar21 + 0x78;
    } while (lVar20 * 0x78 - lVar21 != 0);
  }
  if (((bVar11 != false) && (bVar11 = ON_BrepFaceArray::Read(&this->m_F,file), bVar11)) &&
     (0 < (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count)) {
    lVar20 = 0;
    lVar21 = 0;
    do {
      pOVar5 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
      *(ON_Brep **)((long)(&pOVar5->m_face_uuid + 7) + lVar20 + 0xc) = this;
      iVar15 = *(int *)((pOVar5->m_face_uuid).Data4 + lVar20 + -0x14);
      if ((-1 < (long)iVar15) && (iVar15 < local_19c)) {
        ON_SurfaceProxy::SetProxySurface
                  ((ON_SurfaceProxy *)((pOVar5->m_face_uuid).Data4 + lVar20 + -0x5c),
                   (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[iVar15]);
      }
      lVar21 = lVar21 + 1;
      lVar20 = lVar20 + 0xd8;
    } while (lVar21 < (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>
                      .m_count);
  }
  if (bVar11 != false) {
    bVar11 = ON_BinaryArchive::ReadPoint(file,&(this->m_bbox).m_min);
  }
  if (bVar11 != false) {
    bVar11 = ON_BinaryArchive::ReadPoint(file,&(this->m_bbox).m_max);
  }
  ReadFillInMissingBoxes(this);
  if ((bVar11 != false) && (0 < local_1cc)) {
    uVar14 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count;
    local_f8.m_min.x = (double)((ulong)local_f8.m_min.x & 0xffffffff00000000);
    local_168.m_min.x = 0.0;
    bVar11 = ON_BinaryArchive::BeginRead3dmBigChunk(file,(uint *)&local_f8,(ON__INT64 *)&local_168);
    if (bVar11) {
      bVar13 = false;
      if ((local_f8.m_min.x._0_4_ == 0x40008000) && (bVar13 = bVar11, bVar11 && 0 < (int)uVar14)) {
        lVar20 = 0;
        uVar18 = 1;
        do {
          bVar13 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_128);
          if ((bVar13) && (local_128.m_min.x._0_1_ != '\0')) {
            local_198.m_min.x = 0.0;
            iVar15 = ON_BinaryArchive::ReadObject(file,(ON_Object **)&local_198);
            bVar13 = iVar15 != 0;
            if ((ON_Object *)local_198.m_min.x != (ON_Object *)0x0) {
              pOVar16 = ON_Mesh::Cast((ON_Object *)local_198.m_min.x);
              if (pOVar16 == (ON_Mesh *)0x0) {
                if ((ON_Object *)local_198.m_min.x != (ON_Object *)0x0) {
                  (*(*(_func_int ***)local_198.m_min.x)[4])();
                }
              }
              else {
                ON_BrepFace::SetMesh
                          ((ON_BrepFace *)
                           ((((this->m_F).super_ON_ObjectArray<ON_BrepFace>.
                              super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 +
                           lVar20 + -0x5c),render_mesh,pOVar16);
              }
            }
          }
          if (bVar13 == false) break;
          lVar20 = lVar20 + 0xd8;
          bVar11 = uVar18 < uVar14;
          uVar18 = uVar18 + 1;
        } while (bVar11);
      }
      bVar12 = ON_BinaryArchive::EndRead3dmChunk(file);
      bVar11 = false;
      if (bVar12) {
        bVar11 = bVar13;
      }
    }
    if (bVar11 != false) {
      local_f8.m_min.x = (double)((ulong)local_f8.m_min.x & 0xffffffff00000000);
      local_168.m_min.x = 0.0;
      bVar11 = ON_BinaryArchive::BeginRead3dmBigChunk
                         (file,(uint *)&local_f8,(ON__INT64 *)&local_168);
      if (bVar11) {
        bVar13 = false;
        if ((local_f8.m_min.x._0_4_ == 0x40008000) && (bVar13 = bVar11, bVar11 && 0 < (int)uVar14))
        {
          lVar20 = 0;
          uVar18 = 1;
          do {
            bVar13 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_128);
            if ((bVar13) && (local_128.m_min.x._0_1_ != '\0')) {
              iVar15 = ON_BinaryArchive::ReadObject(file,(ON_Object **)&local_198);
              bVar13 = iVar15 != 0;
              if ((ON_Object *)local_198.m_min.x != (ON_Object *)0x0) {
                pOVar16 = ON_Mesh::Cast((ON_Object *)local_198.m_min.x);
                if (pOVar16 == (ON_Mesh *)0x0) {
                  if ((ON_Object *)local_198.m_min.x != (ON_Object *)0x0) {
                    (*(*(_func_int ***)local_198.m_min.x)[4])();
                  }
                }
                else {
                  ON_BrepFace::SetMesh
                            ((ON_BrepFace *)
                             ((((this->m_F).super_ON_ObjectArray<ON_BrepFace>.
                                super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 +
                             lVar20 + -0x5c),analysis_mesh,pOVar16);
                }
              }
            }
            if (bVar13 == false) break;
            lVar20 = lVar20 + 0xd8;
            bVar11 = uVar18 < uVar14;
            uVar18 = uVar18 + 1;
          } while (bVar11);
        }
        bVar12 = ON_BinaryArchive::EndRead3dmChunk(file);
        bVar11 = false;
        if (bVar12) {
          bVar11 = bVar13;
        }
      }
    }
  }
  if ((bVar11 == false) || (local_1cc < 2)) goto LAB_0040a881;
  bVar11 = ON_BinaryArchive::ReadInt(file,&this->m_is_solid);
  if (2 < (uint)this->m_is_solid) {
    this->m_is_solid = 0;
  }
  if ((!bVar11) || (local_1cc < 3)) goto LAB_0040a881;
  local_198.m_min.x = (double)((ulong)local_198.m_min.x & 0xffffffff00000000);
  bVar13 = ON_BinaryArchive::BeginRead3dmAnonymousChunk(file,(int *)&local_198);
  if (!bVar13) {
    bVar11 = false;
    goto LAB_0040a881;
  }
  if (local_198.m_min.x._0_4_ < 1) {
    bVar13 = true;
  }
  else {
    local_168.m_min.x = (double)((ulong)local_168.m_min.x & 0xffffffffffffff00);
    bVar12 = ON_BinaryArchive::ReadBool(file,(bool *)&local_168);
    bVar13 = true;
    if (bVar12) {
      if (local_168.m_min.x._0_1_ == '\x01') {
        pOVar17 = (ON_BrepRegionTopology *)operator_new(0x38);
        ON_BrepRegionTopology::ON_BrepRegionTopology(pOVar17);
        this->m_region_topology = pOVar17;
        bVar12 = ON_BrepRegionTopology::Read(pOVar17,file);
        if (!bVar12) {
          pOVar17 = this->m_region_topology;
          if (pOVar17 != (ON_BrepRegionTopology *)0x0) {
            ON_BrepRegionTopology::~ON_BrepRegionTopology(pOVar17);
            operator_delete(pOVar17,0x38);
          }
          this->m_region_topology = (ON_BrepRegionTopology *)0x0;
          goto LAB_0040a864;
        }
      }
      bVar13 = false;
    }
  }
LAB_0040a864:
  bVar12 = ON_BinaryArchive::EndRead3dmChunk(file);
  if (!bVar12) {
    bVar11 = false;
  }
  if (bVar13) {
    bVar11 = false;
  }
LAB_0040a881:
  uVar14 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file);
  if (uVar14 < 0x1317f0a) {
    this->m_is_solid = 0;
  }
  iVar15 = ON_BinaryArchive::Archive3dmVersion(file);
  if (iVar15 < 0x5a) {
    this_00 = &this->m_bbox;
    bVar13 = ON_BoundingBox::IsNotEmpty(this_00);
    if (bVar13) {
      local_98 = (this_00->m_min).x;
      dStack_90 = (this->m_bbox).m_min.y;
      local_88 = (this->m_bbox).m_min.z;
      dStack_80 = (this->m_bbox).m_max.x;
      local_78 = (this->m_bbox).m_max.y;
      dStack_70 = (this->m_bbox).m_max.z;
      local_f8.m_max.y = ON_BoundingBox::EmptyBoundingBox.m_max.y;
      local_f8.m_max.z = ON_BoundingBox::EmptyBoundingBox.m_max.z;
      local_f8.m_min.z = ON_BoundingBox::EmptyBoundingBox.m_min.z;
      local_f8.m_max.x = ON_BoundingBox::EmptyBoundingBox.m_max.x;
      local_f8.m_min.x = ON_BoundingBox::EmptyBoundingBox.m_min.x;
      local_f8.m_min.y = ON_BoundingBox::EmptyBoundingBox.m_min.y;
      uVar18 = (ulong)(uint)(this->m_F).super_ON_ObjectArray<ON_BrepFace>.
                            super_ON_ClassArray<ON_BrepFace>.m_count;
      if (uVar18 != 0) {
        lVar20 = 0;
        do {
          pOVar5 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                   m_a;
          pdVar1 = (double *)
                   ((long)&(((ON_BoundingBox *)((ON_Color *)(&pOVar5->m_face_uuid + 1) + 1))->m_min)
                           .x + lVar20);
          local_c8 = *pdVar1;
          dStack_c0 = pdVar1[1];
          local_b8 = *(double *)((long)(&pOVar5->m_face_uuid + 2) + lVar20 + 4);
          dStack_b0 = ((double *)((long)(&pOVar5->m_face_uuid + 2) + lVar20 + 4))[1];
          local_a8 = *(double *)((long)(&pOVar5->m_face_uuid + 3) + lVar20 + 4);
          dStack_a0 = ((double *)((long)(&pOVar5->m_face_uuid + 3) + lVar20 + 4))[1];
          ON_BrepFace::InternalFaceBoundingBox
                    (&local_128,(ON_BrepFace *)((pOVar5->m_face_uuid).Data4 + lVar20 + -0x5c),false,
                     false);
          local_198.m_max.y = local_128.m_max.y;
          local_198.m_max.z = local_128.m_max.z;
          local_198.m_min.z = local_128.m_min.z;
          local_198.m_max.x = local_128.m_max.x;
          local_198.m_min.x = local_128.m_min.x;
          local_198.m_min.y = local_128.m_min.y;
          local_168.m_max.y = local_a8;
          local_168.m_max.z = dStack_a0;
          local_168.m_min.z = local_b8;
          local_168.m_max.x = dStack_b0;
          local_168.m_min.x = local_c8;
          local_168.m_min.y = dStack_c0;
          bVar13 = ON_BoundingBox::IsNotEmpty(&local_198);
          pOVar19 = &local_168;
          if ((bVar13) &&
             (bVar13 = ON_BoundingBox::IsValid(&local_168), pOVar19 = &local_198, bVar13)) {
            ON_BoundingBox::Includes(&local_168,&local_198,false);
          }
          a = (ON_BoundingBox *)
              ((long)&(((ON_BoundingBox *)((ON_Color *)(&pOVar5->m_face_uuid + 1) + 1))->m_min).x +
              lVar20);
          local_68 = (pOVar19->m_min).x;
          dStack_60 = (pOVar19->m_min).y;
          local_58 = (pOVar19->m_min).z;
          dStack_50 = (pOVar19->m_max).x;
          local_48 = (pOVar19->m_max).y;
          dStack_40 = (pOVar19->m_max).z;
          *(double *)((long)(&pOVar5->m_face_uuid + 3) + lVar20 + 4) = local_48;
          *(double *)((long)(&pOVar5->m_face_uuid + 3) + lVar20 + 0xc) = dStack_40;
          *(double *)((long)(&pOVar5->m_face_uuid + 2) + lVar20 + 4) = local_58;
          *(double *)((long)(&pOVar5->m_face_uuid + 2) + lVar20 + 0xc) = dStack_50;
          (a->m_min).x = local_68;
          *(double *)((long)((ON_Color *)(&pOVar5->m_face_uuid + 1) + 3) + lVar20) = dStack_60;
          ON_BoundingBox::Union(&local_f8,a);
          lVar20 = lVar20 + 0xd8;
        } while (uVar18 * 0xd8 - lVar20 != 0);
      }
      pOVar19 = &local_198;
      local_198.m_max.y = local_f8.m_max.y;
      local_198.m_max.z = local_f8.m_max.z;
      local_198.m_min.z = local_f8.m_min.z;
      local_198.m_max.x = local_f8.m_max.x;
      local_198.m_min.x = local_f8.m_min.x;
      local_198.m_min.y = local_f8.m_min.y;
      local_168.m_max.y = local_78;
      local_168.m_max.z = dStack_70;
      local_168.m_min.z = local_88;
      local_168.m_max.x = dStack_80;
      local_168.m_min.x = local_98;
      local_168.m_min.y = dStack_90;
      bVar13 = ON_BoundingBox::IsNotEmpty(pOVar19);
      if (bVar13) {
        bVar13 = ON_BoundingBox::IsValid(&local_168);
        if (bVar13) {
          pOVar19 = &local_198;
          ON_BoundingBox::Includes(&local_168,pOVar19,false);
        }
      }
      else {
        pOVar19 = &local_168;
      }
      dVar6 = (pOVar19->m_min).x;
      dVar7 = (pOVar19->m_min).y;
      dVar8 = (pOVar19->m_min).z;
      dVar9 = (pOVar19->m_max).x;
      dVar10 = (pOVar19->m_max).z;
      (this->m_bbox).m_max.y = (pOVar19->m_max).y;
      (this->m_bbox).m_max.z = dVar10;
      (this->m_bbox).m_min.z = dVar8;
      (this->m_bbox).m_max.x = dVar9;
      (this_00->m_min).x = dVar6;
      (this->m_bbox).m_min.y = dVar7;
    }
  }
  return bVar11;
}

Assistant:

bool ON_Brep::Read( ON_BinaryArchive& file )
{
  int i;
  int C2_count = 0;
  int C3_count = 0;
  int S_count = 0;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion( &major_version, &minor_version );
  if ( rc && major_version == 2 ) 
  {
    rc = ReadOld200(file,minor_version); // legacy trimmed face
  }
  else if ( rc && major_version == 3 ) 
  {
    // 2d curves
    if (rc) 
      rc = m_C2.Read(file);
    C2_count = m_C2.Count();

    // 3d curves
    if (rc) 
      rc = m_C3.Read(file);
    C3_count = m_C3.Count();

    // untrimmed surfaces
    if (rc) 
      rc = m_S.Read(file);
    S_count = m_S.Count();

    // vertices
    if (rc) 
      rc = m_V.Read(file);

    // edges
    if (rc) 
    {
      rc = m_E.Read(file);
      if (rc) {
        for ( i = 0; i < m_E.Count(); i++ ) {
          ON_BrepEdge& e = m_E[i];
          e.m_brep = this;
          if ( e.m_c3i >= 0 && e.m_c3i < C3_count )
          {
            bool bProxyCurveIsReversed = e.ProxyCurveIsReversed();
            ON_Interval pdom = e.ProxyCurveDomain();
            ON_Interval edom = e.Domain();
            e.SetProxyCurve( m_C3[e.m_c3i], pdom );
            if ( bProxyCurveIsReversed )
              e.ON_CurveProxy::Reverse();
            e.SetDomain(edom);
          }
        }
      }
    }

    // trims
    if (rc) 
    {
      rc = m_T.Read(file);
      if (rc) {
        for ( i = 0; i < m_T.Count(); i++ ) {
          ON_BrepTrim& trim = m_T[i];
          trim.m_brep = this;
          if ( trim.m_c2i >= 0 && trim.m_c2i < C2_count )
          {
            bool bProxyCurveIsReversed = trim.ProxyCurveIsReversed();
            ON_Interval pdom = trim.ProxyCurveDomain();
            ON_Interval tdom = trim.Domain();
            trim.SetProxyCurve( m_C2[trim.m_c2i], pdom );
            if ( bProxyCurveIsReversed )
              trim.ON_CurveProxy::Reverse();
            trim.SetDomain(tdom);
          }
        }
      }
    }

    // loops
    if (rc) 
    {
      rc = m_L.Read(file);
      if ( rc )
      {
        for ( i = 0; i < m_L.Count(); i++ ) 
        {
          m_L[i].m_brep = this;
        }
      }
    }

    // faces
    if (rc) 
    {
      rc = m_F.Read(file);
      if (rc) {
        for ( i = 0; i < m_F.Count(); i++ ) {
          ON_BrepFace& f = m_F[i];
          f.m_brep = this;
          if ( f.m_si >= 0 && f.m_si < S_count )
            f.SetProxySurface(m_S[f.m_si]);
        }
      }
    }

    // bounding box
    if (rc) 
      rc = file.ReadPoint( m_bbox.m_min );
    if (rc) 
      rc = file.ReadPoint( m_bbox.m_max );

    // fill in missing information
    ReadFillInMissingBoxes(*this);

    // end of chunk version 3.0

    if (rc && minor_version >= 1 )
    {
      // added for chunk version 3.1

      ON_Object* obj;
      ON__UINT32 tcode = 0;
      ON__INT64 length_TCODE_ANONYMOUS_CHUNK = 0;
      int fi;
      unsigned char b;

      const int face_count = m_F.Count();

      // read render meshes
      tcode = 0;
      length_TCODE_ANONYMOUS_CHUNK = 0;
      rc = file.BeginRead3dmBigChunk( &tcode, &length_TCODE_ANONYMOUS_CHUNK );
      if ( rc )
      {
        if ( tcode != TCODE_ANONYMOUS_CHUNK )
          rc = false;
        else
        {
          for ( fi = 0; rc && fi < face_count; fi++ ) 
          {
            rc = file.ReadChar(&b);
            if (rc && b) 
            {
              obj = 0;
              rc = file.ReadObject(&obj);
              if ( 0 != obj )
              {
                auto pMesh = ON_Mesh::Cast(obj);
                if (nullptr == pMesh)
                {
                  delete obj;
                }
                else
                {
                  m_F[fi].SetMesh(ON::render_mesh, pMesh);
                }
              }
            }
          }
        }
        if ( !file.EndRead3dmChunk() )
          rc = false;
      }

      if (rc)
      {
        // read analysis meshes
        tcode = 0;
        length_TCODE_ANONYMOUS_CHUNK = 0;
        rc = file.BeginRead3dmBigChunk( &tcode, &length_TCODE_ANONYMOUS_CHUNK );
        if ( rc )
        {
          if ( tcode != TCODE_ANONYMOUS_CHUNK )
            rc = false;
          else
          {
            for ( fi = 0; rc && fi < face_count; fi++ ) 
            {
              rc = file.ReadChar(&b);
              if (rc && b) 
              {
                rc = file.ReadObject(&obj);
                
                if (nullptr != obj)
                {
                  auto pMesh = ON_Mesh::Cast(obj);
                  if (nullptr == pMesh)
                  {
                    delete obj;
                  }
                  else
                  {
                    m_F[fi].SetMesh(ON::analysis_mesh, pMesh);
                  }
                }
              }
            }
          }
          if ( !file.EndRead3dmChunk() )
            rc = false;
        }
      }
    }

    if ( rc && minor_version >= 2 )
    {
      rc =  file.ReadInt( &m_is_solid );
      if ( m_is_solid < 0 || m_is_solid >= 3 )
        m_is_solid = 0;
      if (rc && minor_version >= 3)
      {
        // begin chunk verson 3.3

        // region topology chunk added
        int region_topology_chunk_version = 0;
        if (!file.BeginRead3dmAnonymousChunk(&region_topology_chunk_version))
          rc = false;
        else
        {
          bool rc1 = false;
          for (;;)
          {
            if (region_topology_chunk_version < 1)
              break;

            bool bReadRegionTopology = false;
            if (!file.ReadBool(&bReadRegionTopology))
              break;

            if (bReadRegionTopology)
            {
              m_region_topology = new ON_BrepRegionTopology();
              if (!m_region_topology->Read(file))
              {
                delete m_region_topology;
                m_region_topology = nullptr;
                break;
              }
            }
            rc1 = true;
            break;
          }
          if (!file.EndRead3dmChunk())
            rc1 = false;
          if (false == rc1)
            rc = false;
        }
      }
    }
  }

  if ( file.ArchiveOpenNURBSVersion() < 20021002 )
  {
    m_is_solid = 0;
  }

  // GBA 3-Sept-20 RH-60112
  // In V6 and earlier bounding boxes of faces were bounding box of underlying surface.
  // This can result in enourmous boxes which mess up make2d
  // In V7 bounding boxes use the trim pbox resulting in resonable boxes.
  ////if (file.Archive3dmVersion() < 70 || file.ArchiveOpenNURBSVersion() < 2382395020)
  ////{
  ////  if (!m_bbox.IsEmpty())
  ////  {
  ////    ON_BoundingBox orig_box = m_bbox;
  ////    ClearBoundingBox();
  ////    BoundingBox();                    // compute bounding box
  ////    m_bbox.Intersection(orig_box);
  ////  }
  ////}

  // Dale Lear https://mcneel.myjetbrains.com/youtrack/issue/RH-64277
  // The test used to fix RH-60112 was not adequate and now the set of
  // active v7 3dm files has lots of cases with breps that have
  // oversized bounding boxes by the new standard avter Greg's RH-60112 changes.
  // We have already started writing V8 files and those versions of V8
  // have been used by some of our Discourse early adopters.
  // At this point, I'm going to assume a bounding box read from a V7 or V8 file
  // can be too big. By the time V9 rolls around, the boxes should be cleaned up.
  if (file.Archive3dmVersion() < 90 && m_bbox.IsNotEmpty() )
  {
    const ON_BoundingBox archive_brep_bbox = m_bbox;
    ON_BoundingBox new_brep_bbox = ON_BoundingBox::EmptyBoundingBox;
    const unsigned int face_count = m_F.UnsignedCount();
    for (unsigned fi = 0; fi < face_count; ++fi)
    {
      ON_BrepFace& f = this->m_F[fi];
      const ON_BoundingBox archive_face_bbox = f.m_bbox;
      ON_BoundingBox new_face_bbox = f.InternalFaceBoundingBox(false, false);
      f.m_bbox = Internal_BestBoundingBox(archive_face_bbox, new_face_bbox);
      new_brep_bbox.Union(f.m_bbox);
    }
    m_bbox = Internal_BestBoundingBox(archive_brep_bbox, new_brep_bbox);
  }

  return rc;
}